

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

ResolveResult * __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  byte bVar1;
  uint uVar2;
  BrandedDecl *pBVar3;
  ErrorReporter *errorReporter;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Builder target;
  RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *ppBVar10;
  BrandScope **ppBVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  BrandScope **ppBVar15;
  BrandScope *pBVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Builder scope;
  Builder bindings;
  Builder scopes;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> local_168;
  ulong local_140;
  ulong local_138;
  BrandScope *local_130;
  StructBuilder local_128;
  StructBuilder local_f8;
  undefined8 uStack_d0;
  PointerBuilder local_c8;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  ulong uVar20;
  
  uVar2 = (this->body).tag;
  __return_storage_ptr__->tag = uVar2;
  if (uVar2 == 2) {
    uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    (__return_storage_ptr__->field_1).forceAligned = (this->body).field_1.forceAligned;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar5;
  }
  else if (uVar2 == 1) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x20);
    pvVar4 = (this->body).field_1.forceAligned;
    uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x18);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x10);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = uVar6;
    (__return_storage_ptr__->field_1).forceAligned = pvVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar5;
    bVar1 = (this->body).field_1.space[0x28];
    (__return_storage_ptr__->field_1).space[0x28] = bVar1;
    if (bVar1 == '\x01') {
      uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 0x30);
      uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x38);
      uVar7 = *(undefined8 *)((long)&(this->body).field_1 + 0x40);
      uVar8 = *(undefined8 *)((long)&(this->body).field_1 + 0x48);
      uVar9 = *(undefined8 *)((long)&(this->body).field_1 + 0x58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) =
           *(undefined8 *)((long)&(this->body).field_1 + 0x50);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uVar9;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) = uVar7;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = uVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar5;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = uVar6;
    }
    *(uint64_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = scopeId;
    pBVar16 = (this->brand).ptr;
    local_168.builder.ptr = (BrandScope **)0x0;
    local_168.builder.pos = (BrandScope **)0x0;
    local_168.builder.endPtr = (BrandScope **)0x0;
    ppBVar11 = (BrandScope **)0x0;
    local_130 = pBVar16;
    do {
      if (((pBVar16->params).size_ != 0) ||
         ((pBVar16->inherited == true && (pBVar16->leafParamCount != 0)))) {
        if (ppBVar11 == local_168.builder.endPtr) {
          sVar14 = (long)ppBVar11 - (long)local_168.builder.ptr >> 2;
          if (ppBVar11 == local_168.builder.ptr) {
            sVar14 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity(&local_168,sVar14);
          ppBVar11 = local_168.builder.pos;
        }
        *ppBVar11 = pBVar16;
        ppBVar11 = local_168.builder.pos + 1;
        local_168.builder.pos = ppBVar11;
      }
      pBVar16 = (pBVar16->parent).ptr.ptr;
    } while (pBVar16 != (BrandScope *)0x0);
    ppBVar15 = local_168.builder.ptr;
    if (ppBVar11 != local_168.builder.ptr) {
      capnp::_::StructBuilder::asReader(&brandBuilder._builder);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_f8._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uStack_d0;
      *(void **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_f8.data;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_f8.pointers;
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_f8.segment;
      *(CapTableBuilder **)((long)&__return_storage_ptr__->field_1 + 0x38) = local_f8.capTable;
      (__return_storage_ptr__->field_1).space[0x28] = '\x01';
      local_f8.segment = brandBuilder._builder.segment;
      local_f8.capTable = brandBuilder._builder.capTable;
      local_f8.data = brandBuilder._builder.pointers;
      capnp::_::PointerBuilder::initStructList
                (&local_58,(PointerBuilder *)&local_f8,
                 (ElementCount)
                 ((ulong)((long)local_168.builder.pos - (long)local_168.builder.ptr) >> 3),
                 (StructSize)0x10002);
      ppBVar15 = local_168.builder.ptr;
      if ((long)local_168.builder.pos - (long)local_168.builder.ptr != 0) {
        uVar12 = (long)local_168.builder.pos - (long)local_168.builder.ptr >> 3;
        uVar19 = 0;
        local_140 = uVar12;
        do {
          capnp::_::ListBuilder::getStructElement(&local_f8,&local_58,(ElementCount)uVar19);
          pBVar16 = local_168.builder.ptr[uVar19 & 0xffffffff];
          *(uint64_t *)local_f8.data = pBVar16->leafId;
          if (pBVar16->inherited == true) {
            *(undefined2 *)&(((WirePointer *)((long)local_f8.data + 8))->offsetAndKind).value = 1;
            uVar20 = uVar19;
          }
          else {
            sVar14 = (pBVar16->params).size_;
            *(undefined2 *)&(((WirePointer *)((long)local_f8.data + 8))->offsetAndKind).value = 0;
            local_128.segment = local_f8.segment;
            local_128.capTable = local_f8.capTable;
            local_128.data = local_f8.pointers;
            local_138 = uVar19;
            capnp::_::PointerBuilder::initStructList
                      (&local_80,(PointerBuilder *)&local_128,(ElementCount)sVar14,
                       (StructSize)0x10001);
            uVar17 = (ulong)local_80.elementCount;
            uVar12 = local_140;
            uVar20 = local_138;
            if (uVar17 != 0) {
              lVar18 = 0;
              uVar13 = 0;
              do {
                pBVar3 = (local_168.builder.ptr[uVar19 & 0xffffffff]->params).ptr;
                errorReporter = local_130->errorReporter;
                capnp::_::ListBuilder::getStructElement(&local_128,&local_80,(ElementCount)uVar13);
                *(undefined2 *)&((WireValue<uint32_t> *)local_128.data)->value = 1;
                local_c8.segment = local_128.segment;
                local_c8.capTable = local_128.capTable;
                local_c8.pointer = local_128.pointers;
                capnp::_::PointerBuilder::initStruct(&local_a8,&local_c8,(StructSize)0x10003);
                target._builder.capTable = local_a8.capTable;
                target._builder.segment = local_a8.segment;
                target._builder.data = local_a8.data;
                target._builder.pointers = local_a8.pointers;
                target._builder.dataSize = local_a8.dataSize;
                target._builder.pointerCount = local_a8.pointerCount;
                target._builder._38_2_ = local_a8._38_2_;
                compileAsType((BrandedDecl *)((long)&(pBVar3->body).tag + lVar18),errorReporter,
                              target);
                uVar13 = uVar13 + 1;
                lVar18 = lVar18 + 0xa8;
                uVar12 = local_140;
                uVar20 = local_138;
              } while (uVar17 != uVar13);
            }
          }
          uVar19 = uVar20 + 1;
          ppBVar15 = local_168.builder.ptr;
        } while (uVar19 != uVar12);
      }
    }
    ppBVar11 = local_168.builder.endPtr;
    ppBVar10 = local_168.builder.pos;
    if (ppBVar15 != (BrandScope **)0x0) {
      local_168.builder.ptr = (BrandScope **)0x0;
      local_168.builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::BrandScope_*> *)0x0;
      local_168.builder.endPtr = (BrandScope **)0x0;
      (**(local_168.builder.disposer)->_vptr_ArrayDisposer)
                (local_168.builder.disposer,ppBVar15,8,(long)ppBVar10 - (long)ppBVar15 >> 3,
                 (long)ppBVar11 - (long)ppBVar15 >> 3,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Top() = default;